

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O1

void __thiscall
ST::string::to_buffer(string *this,char_buffer *result,bool utf8,bool substitute_out_of_range)

{
  ulong __n;
  ulong uVar1;
  char *pcVar2;
  undefined7 in_register_00000011;
  char_buffer local_40;
  
  if ((int)CONCAT71(in_register_00000011,utf8) == 0) {
    utf8_to_latin_1(&local_40,(this->m_buffer).m_chars,(this->m_buffer).m_size,assume_valid,
                    substitute_out_of_range);
    pcVar2 = result->m_chars;
    result->m_chars = local_40.m_chars;
    uVar1 = result->m_size;
    result->m_size = local_40.m_size;
    *(undefined8 *)result->m_data = local_40.m_data._0_8_;
    *(undefined8 *)(result->m_data + 8) = local_40.m_data._8_8_;
    local_40.m_chars = pcVar2;
    __n = local_40.m_size;
  }
  else {
    local_40.m_size = 0;
    __n = (this->m_buffer).m_size;
    if (__n < 0x10) {
      local_40.m_chars = local_40.m_data;
      local_40.m_data._0_8_ = *(undefined8 *)(this->m_buffer).m_data;
      local_40.m_data._8_8_ = *(undefined8 *)((this->m_buffer).m_data + 8);
    }
    else {
      pcVar2 = (char *)operator_new__(__n + 1);
      local_40.m_chars = pcVar2;
      memcpy(pcVar2,(this->m_buffer).m_chars,__n);
      pcVar2[__n] = '\0';
    }
    pcVar2 = result->m_chars;
    result->m_chars = local_40.m_chars;
    uVar1 = result->m_size;
    result->m_size = __n;
    *(undefined8 *)result->m_data = local_40.m_data._0_8_;
    *(undefined8 *)(result->m_data + 8) = local_40.m_data._8_8_;
    local_40.m_chars = pcVar2;
  }
  local_40.m_size = uVar1;
  if (__n < 0x10) {
    result->m_chars = result->m_data;
  }
  if (local_40.m_chars != (char *)0x0 && 0xf < local_40.m_size) {
    operator_delete__(local_40.m_chars);
  }
  return;
}

Assistant:

void to_buffer(char_buffer &result, bool utf8 = true,
                       bool substitute_out_of_range = true) const
        {
            if (utf8)
                result = to_utf8();
            else
                result = to_latin_1(substitute_out_of_range);
        }